

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

grp_stack_data pop_grp_stack(grp_stack *mystack)

{
  grp_stack_item *last;
  grp_stack_item_struct *pgVar1;
  grp_stack_data in_RAX;
  
  if ((mystack != (grp_stack *)0x0) && (last = mystack->top, last != (grp_stack_item *)0x0)) {
    pgVar1 = last->prev;
    in_RAX = grp_stack_remove(last);
    mystack->top = pgVar1;
    mystack->stack_size = mystack->stack_size - 1;
    if (mystack->stack_size == 0) {
      mystack->top = (grp_stack_item *)0x0;
    }
  }
  return in_RAX;
}

Assistant:

static grp_stack_data pop_grp_stack(grp_stack* mystack) {
  grp_stack_data retval = grp_stack_default;
  if(mystack && mystack->top) {
    grp_stack_item* newtop = mystack->top->prev;
    retval = grp_stack_remove(mystack->top);
    mystack->top = newtop;
    if(0 == --mystack->stack_size) mystack->top = NULL;
  }
  return retval;
}